

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O3

vector<sha256_hash> * __thiscall
libtorrent::aux::merkle_tree::get_piece_layer
          (vector<sha256_hash> *__return_storage_ptr__,merkle_tree *this)

{
  mode_t mVar1;
  pointer pdVar2;
  iterator __position;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  pointer pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  span<const_libtorrent::digest32<256L>_> leaves;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> scratch_space;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> local_98;
  long local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  sha256_hash local_50;
  
  (__return_storage_ptr__->
  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mVar1 = this->m_mode;
  if (mVar1 == block_layer) {
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::reserve
              (&__return_storage_ptr__->
                super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ,(long)((1 << (this->m_blocks_per_piece_log & 0x1f)) + this->m_num_blocks + -1 >>
                      (this->m_blocks_per_piece_log & 0x1f)));
    local_98.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3 = 1 << (this->m_blocks_per_piece_log & 0x1f);
    pdVar8 = (this->m_tree).
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(this->m_tree).
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  .
                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 5;
    if (0 < (int)lVar6) {
      lVar10 = (long)iVar3;
      local_80 = lVar10 << 5;
      lVar11 = 0;
      lVar7 = 0;
      lVar9 = 0;
      do {
        leaves.m_ptr = (digest32<256L> *)((long)(pdVar8->m_number)._M_elems + lVar7);
        leaves.m_len = lVar6 + lVar11;
        local_78 = 0;
        uStack_70 = 0;
        local_68 = 0;
        uStack_60 = 0;
        merkle_root_scratch(&local_50,leaves,iVar3,(sha256_hash)ZEXT1632(ZEXT816(0)),&local_98);
        __position._M_current =
             (__return_storage_ptr__->
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>)
             .
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
          _M_realloc_insert<libtorrent::digest32<256l>>
                    ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>
                      *)__return_storage_ptr__,__position,&local_50);
        }
        else {
          *(undefined8 *)(((__position._M_current)->m_number)._M_elems + 4) =
               local_50.m_number._M_elems._16_8_;
          *(undefined8 *)(((__position._M_current)->m_number)._M_elems + 6) =
               local_50.m_number._M_elems._24_8_;
          *(undefined8 *)((__position._M_current)->m_number)._M_elems =
               local_50.m_number._M_elems._0_8_;
          *(undefined8 *)(((__position._M_current)->m_number)._M_elems + 2) =
               local_50.m_number._M_elems._8_8_;
          (__return_storage_ptr__->
          super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        lVar9 = lVar9 + lVar10;
        pdVar8 = (this->m_tree).
                 super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 .
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)(this->m_tree).
                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      .
                      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar8;
        lVar6 = (long)uVar5 >> 5;
        lVar7 = lVar7 + local_80;
        lVar11 = lVar11 - lVar10;
      } while (lVar9 < (int)(uVar5 >> 5));
      if (local_98.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else if (mVar1 == piece_layer) {
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
    operator=(&__return_storage_ptr__->
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
              ,&(this->m_tree).
                super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             );
  }
  else if (mVar1 == full_tree) {
    pdVar8 = (this->m_tree).
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = merkle_num_leafs(this->m_num_blocks + (1 << (this->m_blocks_per_piece_log & 0x1f)) + -1
                             >> (this->m_blocks_per_piece_log & 0x1f));
    iVar3 = merkle_first_leaf(iVar3);
    pdVar2 = (this->m_tree).
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = merkle_num_leafs(this->m_num_blocks + (1 << (this->m_blocks_per_piece_log & 0x1f)) + -1
                             >> (this->m_blocks_per_piece_log & 0x1f));
    iVar4 = merkle_first_leaf(iVar4);
    ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<libtorrent::digest32<256l>const*,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>
              ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
               __return_storage_ptr__,pdVar8 + iVar3,
               pdVar2 + (long)((1 << (this->m_blocks_per_piece_log & 0x1f)) + this->m_num_blocks +
                               -1 >> (this->m_blocks_per_piece_log & 0x1f)) + (long)iVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

aux::vector<sha256_hash> merkle_tree::get_piece_layer() const
	{
		aux::vector<sha256_hash> ret;

		switch (m_mode)
		{
			case mode_t::uninitialized_tree: break;
			case mode_t::empty_tree: break;
			case mode_t::full_tree:
				ret.assign(m_tree.begin() + piece_layer_start()
					, m_tree.begin() + piece_layer_start() + num_pieces());
				break;
			case mode_t::piece_layer:
			{
				ret = m_tree;
				break;
			}
			case mode_t::block_layer:
			{
				ret.reserve(num_pieces());
				std::vector<sha256_hash> scratch_space;

				int const blocks_in_piece = blocks_per_piece();
				for (int b = 0; b < int(m_tree.size()); b += blocks_in_piece)
				{
					auto const leafs = span<sha256_hash const>(m_tree).subspan(b);
					ret.push_back(merkle_root_scratch(leafs, blocks_in_piece, sha256_hash{}, scratch_space));
				}
				break;
			}
		}
		return ret;
	}